

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isprint.c
# Opt level: O2

int main(void)

{
  _PDCLIB_lc_ctype_entry_t *p_Var1;
  
  p_Var1 = _PDCLIB_lc_ctype->entry;
  if ((p_Var1[0x61].flags & 8) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1b,"isprint( \'a\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x7a].flags & 8) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1c,"isprint( \'z\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x41].flags & 8) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1d,"isprint( \'A\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x5a].flags & 8) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1e,"isprint( \'Z\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x40].flags & 8) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x1f,"isprint( \'@\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[9].flags & 8) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x20,"! isprint( \'\\t\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1->flags & 8) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isprint.c, line %d - %s\n"
           ,0x21,"! isprint( \'\\0\' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isprint( 'a' ) );
    TESTCASE( isprint( 'z' ) );
    TESTCASE( isprint( 'A' ) );
    TESTCASE( isprint( 'Z' ) );
    TESTCASE( isprint( '@' ) );
    TESTCASE( ! isprint( '\t' ) );
    TESTCASE( ! isprint( '\0' ) );
    TESTCASE( isprint( ' ' ) );
    return TEST_RESULTS;
}